

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O2

int cram_get_bam_seq(cram_fd *fd,bam_seq_t **bam)

{
  uint uVar1;
  SAM_hdr *pSVar2;
  cram_slice *pcVar3;
  char *__s;
  bam_seq_t *pbVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  cram_record *pcVar9;
  int iVar10;
  ulong uVar11;
  uchar *puVar13;
  uchar *puVar14;
  size_t sVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t *__dest;
  int iVar18;
  char *qname;
  uchar local_438 [1032];
  long lVar12;
  
  pcVar9 = cram_get_seq(fd);
  if (pcVar9 == (cram_record *)0x0) {
    iVar18 = -1;
  }
  else {
    pSVar2 = fd->header;
    pcVar3 = fd->ctr->slice;
    if ((fd->required_fields & 1) == 0) {
      qname = "?";
      iVar8 = 1;
    }
    else {
      iVar8 = pcVar9->name_len;
      if (iVar8 == 0) {
        iVar18 = fd->ctr->curr_rec;
        __s = fd->prefix;
        sVar15 = strlen(__s);
        sVar15 = (size_t)(int)sVar15;
        qname = (char *)local_438;
        memcpy(qname,__s,sVar15);
        puVar13 = local_438 + sVar15 + 1;
        local_438[sVar15] = ':';
        uVar1 = pcVar9->mate_line;
        lVar12 = (ulong)uVar1 + 1;
        if (iVar18 + -1 <= (int)uVar1) {
          lVar12 = (long)iVar18;
        }
        if ((int)uVar1 < 0) {
          lVar12 = (long)iVar18;
        }
        uVar11 = lVar12 + pcVar3->hdr->record_counter;
        if (uVar11 >> 0x20 == 0) {
          puVar13 = append_uint32(puVar13,(uint32_t)uVar11);
          iVar8 = (int)puVar13;
        }
        else {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar11;
          if (uVar11 < 0xde0b6b3e2feca00) {
            puVar13 = append_uint32(puVar13,SUB164(auVar5 / ZEXT816(1000000000),0));
          }
          else {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar11;
            puVar13 = append_uint32(puVar13,SUB164(auVar6 / ZEXT816(1000000000000000000),0));
            auVar7._8_8_ = 0;
            auVar7._0_8_ = SUB168(auVar5 / ZEXT816(1000000000),0);
            puVar13 = append_sub32(puVar13,SUB164(auVar7 % ZEXT816(1000000000),0));
          }
          puVar13 = append_sub32(puVar13,(uint32_t)(uVar11 % 1000000000));
          iVar8 = (int)puVar13;
        }
        iVar8 = iVar8 - (int)qname;
      }
      else {
        qname = (char *)(pcVar3->name_blk->data + pcVar9->name);
      }
    }
    iVar10 = pcVar9->rg;
    iVar18 = -1;
    if ((-2 < (long)iVar10) && (iVar10 < pSVar2->nrg)) {
      if (iVar10 == -1) {
        iVar10 = 0;
      }
      else {
        iVar10 = pSVar2->rg[iVar10].name_len + 4;
      }
      uVar1 = fd->required_fields;
      if ((uVar1 & 0x600) == 0) {
        pcVar9->len = 1;
        puVar13 = "*";
      }
      else {
        puVar13 = pcVar3->seqs_blk->data;
        if (puVar13 == (uchar *)0x0) {
          return -1;
        }
        puVar13 = puVar13 + pcVar9->seq;
      }
      if ((uVar1 >> 10 & 1) == 0) {
        puVar14 = (uchar *)0x0;
      }
      else {
        puVar14 = pcVar3->qual_blk->data;
        if (puVar14 == (uchar *)0x0) {
          return -1;
        }
        puVar14 = puVar14 + pcVar9->qual;
      }
      iVar8 = bam_construct_seq(bam,(long)iVar10 + (long)pcVar9->aux_size,qname,(long)iVar8,
                                pcVar9->flags,pcVar9->ref_id,pcVar9->apos,pcVar9->aend,pcVar9->mqual
                                ,pcVar9->ncigar,pcVar3->cigar + pcVar9->cigar,pcVar9->mate_ref_id,
                                pcVar9->mate_pos,pcVar9->tlen,pcVar9->len,(char *)puVar13,
                                (char *)puVar14);
      if (iVar8 != -1) {
        pbVar4 = *bam;
        uVar11 = *(ulong *)&(pbVar4->core).field_0x8;
        iVar18 = (pbVar4->core).l_qseq;
        __dest = pbVar4->data +
                 (long)(iVar18 + 1 >> 1) + (uVar11 >> 0x18 & 0xff) + (long)iVar18 +
                 (uVar11 >> 0x30) * 4;
        puVar16 = __dest;
        if ((long)pcVar9->aux_size != 0) {
          memcpy(__dest,pcVar3->aux_blk->data + pcVar9->aux,(long)pcVar9->aux_size);
          puVar16 = __dest + pcVar9->aux_size;
        }
        puVar17 = puVar16;
        if ((long)pcVar9->rg != -1) {
          sVar15 = (size_t)pSVar2->rg[pcVar9->rg].name_len;
          puVar16[0] = 'R';
          puVar16[1] = 'G';
          puVar16[2] = 'Z';
          memcpy(puVar16 + 3,pSVar2->rg[pcVar9->rg].name,sVar15);
          puVar17 = puVar16 + sVar15 + 4;
          puVar16[sVar15 + 3] = '\0';
        }
        iVar18 = iVar8 + ((int)puVar17 - (int)__dest);
      }
    }
  }
  return iVar18;
}

Assistant:

int cram_get_bam_seq(cram_fd *fd, bam_seq_t **bam) {
    cram_record *cr;
    cram_container *c;
    cram_slice *s;

    if (!(cr = cram_get_seq(fd)))
	return -1;

    c = fd->ctr;
    s = c->slice;

    return cram_to_bam(fd->header, fd, s, cr, c->curr_rec-1, bam);
}